

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O3

void __thiscall mathOps_meas_Test::~mathOps_meas_Test(mathOps_meas_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(mathOps, meas)
{
    measurement um1(5.69, m.pow(3));

    auto um2 = cbrt(um1);
    EXPECT_EQ(um2, root(um1, 3));

    auto um3 = floor(um1);
    EXPECT_DOUBLE_EQ(um3.value(), 5.0);

    auto um4 = trunc(um1);
    EXPECT_DOUBLE_EQ(um4.value(), 5.0);

    auto um5 = ceil(um1);
    EXPECT_DOUBLE_EQ(um5.value(), 6.0);

    auto um6 = round(um1);
    EXPECT_DOUBLE_EQ(um6.value(), 6.0);
}